

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O0

void __thiscall glu::decl::DeclareVariable::~DeclareVariable(DeclareVariable *this)

{
  DeclareVariable *this_local;
  
  std::__cxx11::string::~string((string *)&this->name);
  VarType::~VarType(&this->varType);
  return;
}

Assistant:

DeclareVariable (const VarType& varType_, const std::string& name_, int indentLevel_) : varType(varType_), name(name_), indentLevel(indentLevel_) {}